

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O2

VerifySignatureResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::VerifyEcdsaAdaptorRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
          (VerifySignatureResponseStruct *__return_storage_ptr__,api *this,
          VerifyEcdsaAdaptorRequestStruct *request,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
          *call_function,string *fuction_name)

{
  VerifySignatureResponseStruct local_d8;
  
  VerifySignatureResponseStruct::VerifySignatureResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  ::operator()(&local_d8,
               (function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
                *)request,(VerifyEcdsaAdaptorRequestStruct *)this);
  VerifySignatureResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  VerifySignatureResponseStruct::~VerifySignatureResponseStruct(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}